

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<std::vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>_>::Resize
          (TPZVec<std::vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>_> *this,int64_t newsize)

{
  vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *pvVar1;
  pointer pTVar2;
  undefined1 auVar3 [16];
  ostream *poVar4;
  ulong uVar5;
  int64_t *piVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *pvVar10;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar4 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar9 = this->fNElements;
  if (lVar9 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pvVar10 = this->fStore;
      if (pvVar10 != (vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *)0x0) {
        pTVar2 = pvVar10[-1].super__Vector_base<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
        if (pTVar2 != (pointer)0x0) {
          lVar9 = (long)pTVar2 * 0x18;
          do {
            std::vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>::~vector
                      ((vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *)
                       ((long)&pvVar10[-1].
                               super__Vector_base<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar9));
            lVar9 = lVar9 + -0x18;
          } while (lVar9 != 0);
        }
        operator_delete__(&pvVar10[-1].
                           super__Vector_base<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)pTVar2 * 0x18 + 8);
      }
      this->fStore = (vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *)0x0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = newsize;
      uVar5 = SUB168(auVar3 * ZEXT816(0x18),0);
      uVar7 = uVar5 + 8;
      if (0xfffffffffffffff7 < uVar5) {
        uVar7 = 0xffffffffffffffff;
      }
      if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      piVar6 = (int64_t *)operator_new__(uVar7);
      *piVar6 = newsize;
      pvVar10 = (vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *)(piVar6 + 1);
      memset(pvVar10,0,((uVar5 - 0x18) / 0x18) * 0x18 + 0x18);
      if (newsize <= lVar9) {
        lVar9 = newsize;
      }
      if (0 < lVar9) {
        lVar8 = 0;
        do {
          std::vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>::operator=
                    ((vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *)
                     ((long)&(pvVar10->
                             super__Vector_base<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar8),
                     (vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *)
                     ((long)&(this->fStore->
                             super__Vector_base<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar8));
          lVar8 = lVar8 + 0x18;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      pvVar1 = this->fStore;
      if (pvVar1 != (vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *)0x0) {
        pTVar2 = pvVar1[-1].super__Vector_base<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (pTVar2 != (pointer)0x0) {
          lVar9 = (long)pTVar2 * 0x18;
          do {
            std::vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>::~vector
                      ((vector<TPZGeoElSide,_std::allocator<TPZGeoElSide>_> *)
                       ((long)&pvVar1[-1].
                               super__Vector_base<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar9));
            lVar9 = lVar9 + -0x18;
          } while (lVar9 != 0);
        }
        operator_delete__(&pvVar1[-1].
                           super__Vector_base<TPZGeoElSide,_std::allocator<TPZGeoElSide>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)pTVar2 * 0x18 + 8);
      }
      this->fStore = pvVar10;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}